

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsa_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  PaUtilHostApiRepresentation *pPVar1;
  int iVar2;
  int iVar3;
  PaHostApiTypeId PVar4;
  PaUtilHostApiRepresentation *hostApi_00;
  PaUtilAllocationGroup *pPVar5;
  char *__nptr;
  PaError PVar6;
  PaHostApiIndex hostApiIndex_00;
  int deviceCount;
  void *scanResults;
  
  scanResults = (void *)0x0;
  deviceCount = 0;
  alsa_snd_pcm_hw_params_get_buffer_size = snd_pcm_hw_params_get_buffer_size;
  hostApiIndex_00 = hostApiIndex;
  hostApi_00 = (PaUtilHostApiRepresentation *)PaUtil_AllocateMemory(0x130);
  if (hostApi_00 == (PaUtilHostApiRepresentation *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory( sizeof(PaAlsaHostApiRepresentation) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 769\n"
                     );
    PVar6 = -0x2708;
  }
  else {
    pPVar5 = PaUtil_CreateAllocationGroup();
    hostApi_00[3].privatePaFrontInfo.baseDeviceIndex = (unsigned_long)pPVar5;
    if (pPVar5 == (PaUtilAllocationGroup *)0x0) {
      PaUtil_DebugPrint(
                       "Expression \'alsaHostApi->allocations = PaUtil_CreateAllocationGroup()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 770\n"
                       );
      PVar6 = -0x2708;
    }
    else {
      hostApi_00[3].info.structVersion = hostApiIndex;
      __nptr = (char *)snd_asoundlib_version();
      iVar2 = atoi(__nptr);
      iVar3 = atoi(__nptr + 2);
      PVar4 = atoi(__nptr + 4);
      hostApi_00[3].info.type = PVar4 | iVar2 << 0x10 | iVar3 << 8;
      *hostApi = hostApi_00;
      hostApi_00->deviceInfos = (PaDeviceInfo **)0x0;
      pPVar1 = *hostApi;
      (pPVar1->info).structVersion = 1;
      (pPVar1->info).type = paALSA;
      (pPVar1->info).name = "ALSA";
      (*hostApi)->Terminate = Terminate;
      (*hostApi)->OpenStream = OpenStream;
      (*hostApi)->IsFormatSupported = IsFormatSupported;
      (*hostApi)->ScanDeviceInfos = ScanDeviceInfos;
      (*hostApi)->CommitDeviceInfos = CommitDeviceInfos;
      (*hostApi)->DisposeDeviceInfos = DisposeDeviceInfos;
      ScanDeviceInfos(hostApi_00,hostApiIndex_00,&scanResults,&deviceCount);
      CommitDeviceInfos(hostApi_00,hostApiIndex_00,scanResults,deviceCount);
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)(hostApi_00 + 1),CloseStream,StartStream,StopStream,
                 AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,
                 PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                 PaUtil_DummyGetWriteAvailable);
      PaUtil_InitializeStreamInterface
                ((PaUtilStreamInterface *)(hostApi_00 + 2),CloseStream,StartStream,StopStream,
                 AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad,
                 ReadStream,WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
      paUtilErr_ = PaUnixThreading_Initialize();
      if (-1 < paUtilErr_) {
        return 0;
      }
      PaUtil_DebugPrint(
                       "Expression \'PaUnixThreading_Initialize()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 814\n"
                       );
      PVar6 = paUtilErr_;
    }
    pPVar5 = (PaUtilAllocationGroup *)hostApi_00[3].privatePaFrontInfo.baseDeviceIndex;
    if (pPVar5 != (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeAllAllocations(pPVar5);
      PaUtil_DestroyAllocationGroup
                ((PaUtilAllocationGroup *)hostApi_00[3].privatePaFrontInfo.baseDeviceIndex);
    }
    PaUtil_FreeMemory(hostApi_00);
  }
  return PVar6;
}

Assistant:

PaError PaAlsa_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = NULL;
    void* scanResults = NULL;
    int deviceCount = 0;

    /* Try loading Alsa library. */
    if (!PaAlsa_LoadLibrary())
        return paHostApiNotFound;

    PA_UNLESS( alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory(
                sizeof(PaAlsaHostApiRepresentation) ), paInsufficientMemory );
    PA_UNLESS( alsaHostApi->allocations = PaUtil_CreateAllocationGroup(), paInsufficientMemory );
    alsaHostApi->hostApiIndex = hostApiIndex;
    alsaHostApi->alsaLibVersion = PaAlsaVersionNum();

    *hostApi = (PaUtilHostApiRepresentation*)alsaHostApi;
    (*hostApi)->deviceInfos = NULL;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paALSA;
    (*hostApi)->info.name = "ALSA";

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;
    (*hostApi)->ScanDeviceInfos = ScanDeviceInfos;
    (*hostApi)->CommitDeviceInfos = CommitDeviceInfos;
    (*hostApi)->DisposeDeviceInfos = DisposeDeviceInfos;

    /** If AlsaErrorHandler is to be used, do not forget to unregister callback pointer in
        Terminate function.
    */
    /*ENSURE_( snd_lib_error_set_handler(AlsaErrorHandler), paUnanticipatedHostError );*/

    ScanDeviceInfos(&alsaHostApi->baseHostApiRep, hostApiIndex, &scanResults,
              &deviceCount);
    CommitDeviceInfos(&alsaHostApi->baseHostApiRep, hostApiIndex, scanResults, deviceCount);

    PaUtil_InitializeStreamInterface( &alsaHostApi->callbackStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable,
                                      PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &alsaHostApi->blockingStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream,
                                      GetStreamReadAvailable,
                                      GetStreamWriteAvailable );

    PA_ENSURE( PaUnixThreading_Initialize() );

    return result;

error:
    if( alsaHostApi )
    {
        if( alsaHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( alsaHostApi->allocations );
            PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
        }

        PaUtil_FreeMemory( alsaHostApi );
    }

    return result;
}